

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O3

void GEN_CS::gen_cs_label<true>(cb_to_cs *c,example *ec,label *cs_ld,uint32_t action)

{
  cb_class *pcVar1;
  ulong uVar2;
  float fVar3;
  wclass local_30;
  
  local_30.partial_prediction = 0.0;
  local_30.wap_value = 0.0;
  local_30.class_index = action;
  local_30.x = CB_ALGS::get_cost_pred<true>(c->scorer,c->known_cost,ec,action,c->num_actions);
  v_array<COST_SENSITIVE::wclass>::push_back(&(c->pred_scores).costs,&local_30);
  pcVar1 = c->known_cost;
  if ((pcVar1 != (cb_class *)0x0) && (pcVar1->action == action)) {
    uVar2 = c->nb_ex_regressors + 1;
    c->nb_ex_regressors = uVar2;
    fVar3 = pcVar1->cost - local_30.x;
    c->avg_loss_regressors =
         (fVar3 * fVar3 - c->avg_loss_regressors) * (1.0 / (float)uVar2) + c->avg_loss_regressors;
    c->last_pred_reg = local_30.x;
    fVar3 = pcVar1->cost;
    c->last_correct_cost = fVar3;
    local_30.x = (fVar3 - local_30.x) / pcVar1->probability + local_30.x;
  }
  v_array<COST_SENSITIVE::wclass>::push_back(&cs_ld->costs,&local_30);
  return;
}

Assistant:

void gen_cs_label(cb_to_cs& c, example& ec, COST_SENSITIVE::label& cs_ld, uint32_t action)
{
  COST_SENSITIVE::wclass wc = {0., action, 0., 0.};

  // get cost prediction for this action
  wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, c.known_cost, ec, action, c.num_actions);

  c.pred_scores.costs.push_back(wc);
  // add correction if we observed cost for this action and regressor is wrong
  if (c.known_cost != nullptr && c.known_cost->action == action)
  {
    c.nb_ex_regressors++;
    c.avg_loss_regressors += (1.0f / c.nb_ex_regressors) *
        ((c.known_cost->cost - wc.x) * (c.known_cost->cost - wc.x) - c.avg_loss_regressors);
    c.last_pred_reg = wc.x;
    c.last_correct_cost = c.known_cost->cost;
    wc.x += (c.known_cost->cost - wc.x) / c.known_cost->probability;
  }

  cs_ld.costs.push_back(wc);
}